

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::MacroUsageSyntax::setChild(MacroUsageSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  MacroActualArgumentListSyntax *pMVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    TVar3 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffc8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x9c222a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pMVar2 = (MacroActualArgumentListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x9c223a);
      pMVar2 = SyntaxNode::as<slang::syntax::MacroActualArgumentListSyntax>(pSVar1);
    }
    *(MacroActualArgumentListSyntax **)(in_RDI + 0x28) = pMVar2;
  }
  return;
}

Assistant:

void MacroUsageSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: args = child.node() ? &child.node()->as<MacroActualArgumentListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}